

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

_Bool extent_dalloc_wrapper_try(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  byte bVar1;
  void *addr;
  edata_cache_t *in_RCX;
  tsdn_t *in_RDX;
  void *in_RSI;
  ehooks_t *in_RDI;
  _Bool err;
  tsd_t *tsd;
  uint8_t state;
  undefined7 in_stack_ffffffffffffff90;
  edata_cache_t *edata_cache;
  ehooks_t *in_stack_ffffffffffffffb8;
  ehooks_t *local_38;
  
  if (in_RDI == (ehooks_t *)0x0) {
    local_38 = (ehooks_t *)0x0;
  }
  else {
    local_38 = in_RDI + 0xa4;
    in_stack_ffffffffffffffb8 = in_RDI;
  }
  witness_assert_depth_to_rank((witness_tsdn_t *)local_38,WITNESS_RANK_CORE,0);
  edata_cache = in_RCX;
  addr = edata_base_get((edata_t *)in_RCX);
  edata_addr_set((edata_t *)in_RCX,addr);
  edata_base_get((edata_t *)edata_cache);
  edata_size_get((edata_t *)edata_cache);
  edata_committed_get((edata_t *)edata_cache);
  bVar1 = ehooks_dalloc((tsdn_t *)in_stack_ffffffffffffffb8,in_RDI,in_RSI,(size_t)in_RDX,
                        SUB81((ulong)edata_cache >> 0x38,0));
  if (!(bool)bVar1) {
    duckdb_je_edata_cache_put
              (in_RDX,edata_cache,(edata_t *)CONCAT17(bVar1,in_stack_ffffffffffffff90));
  }
  return (_Bool)(bVar1 & 1);
}

Assistant:

static bool
extent_dalloc_wrapper_try(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	bool err;

	assert(edata_base_get(edata) != NULL);
	assert(edata_size_get(edata) != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	edata_addr_set(edata, edata_base_get(edata));

	/* Try to deallocate. */
	err = ehooks_dalloc(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), edata_committed_get(edata));

	if (!err) {
		edata_cache_put(tsdn, pac->edata_cache, edata);
	}

	return err;
}